

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteKvIoPageDontWrite(unqlite_page *pPage)

{
  int rc;
  unqlite_page *pPage_local;
  
  if (pPage == (unqlite_page *)0x0) {
    pPage_local._4_4_ = 0;
  }
  else {
    pPage_local._4_4_ = unqlitePagerDontWrite(pPage);
  }
  return pPage_local._4_4_;
}

Assistant:

static int unqliteKvIoPageDontWrite(unqlite_page *pPage)
{
	int rc;
	if( pPage == 0 ){
		/* TICKET 1433-0348 */
		return UNQLITE_OK;
	}
	rc = unqlitePagerDontWrite(pPage);
	return rc;
}